

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Controller *this;
  allocator<char> local_a1;
  long *local_a0;
  long *local_98;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  Tools::getInstance();
  Logger::getInstance();
  puVar2 = (undefined8 *)operator_new(0x20);
  local_a0 = puVar2 + 2;
  *puVar2 = local_a0;
  puVar2[1] = 0;
  *(undefined1 *)(puVar2 + 2) = 0;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_98 = puVar3 + 2;
  *puVar3 = local_98;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar4 = (undefined8 *)operator_new(0x20);
  *puVar4 = puVar4 + 2;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  do {
    std::__istream_extract((istream *)&std::cin,(char *)*puVar2,0x7fffffffffffffff);
    std::__istream_extract((istream *)&std::cin,(char *)*puVar3,0x7fffffffffffffff);
    std::__istream_extract((istream *)&std::cin,(char *)*puVar4,0x7fffffffffffffff);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,(char *)*puVar2,&local_a1)
    ;
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    this = (Controller *)operator_new(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,(char *)*puVar3,(allocator<char> *)local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(char *)*puVar4,&local_a1);
    Controller::Controller(this,&local_90,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  } while (iVar1 != 0);
  if ((long *)*puVar2 != local_a0) {
    operator_delete((long *)*puVar2,*local_a0 + 1);
  }
  operator_delete(puVar2,0x20);
  if ((long *)*puVar3 != local_98) {
    operator_delete((long *)*puVar3,*local_98 + 1);
  }
  operator_delete(puVar3,0x20);
  (*(this->
    super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._vptr_ControllerBase[3])(this);
  return 0;
}

Assistant:

int main() {
    Tools *tools = Tools::getInstance();
    Logger *logger = Logger::getInstance();
    string *name = new string();
    string *operation = new string();
    string *argument = new string();
    bool choice = true;
    Controller *controller;
    while (choice) {
        cin >> name->data() >> operation->data() >> argument->data();
        if (string(name->data()) == "ex") {
            choice = false;
        }
        controller = new Controller(operation->data(), argument->data());
    }

    delete name;
    delete operation;
    delete controller;

    return 0;
}